

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_preprocessAndSolveReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool applySimplifier,bool *interrupt)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  double dVar1;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  Settings *pSVar2;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  Result simplificationStatus;
  byte bVar4;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  bool bVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_1c8;
  uint local_178 [4];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined5 uStack_140;
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  uint local_128 [4];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined5 uStack_f0;
  undefined3 uStack_eb;
  int iStack_e8;
  bool bStack_e4;
  undefined8 local_e0;
  cpp_dec_float<100U,_int,_void> local_d8;
  uint local_80 [2];
  uint auStack_78 [2];
  uint local_70 [2];
  uint auStack_68 [2];
  uint local_60 [2];
  uint auStack_58 [2];
  uint local_50 [4];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  this_00 = &(this->_solver).
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .offset;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)this_00,this->_currentSettings->_realParamValues[0x17])
  ;
  (*this->_statistics->preprocessingTime->_vptr_Timer[3])();
  this->_applyPolishing = false;
  if ((int)CONCAT71(in_register_00000031,applySimplifier) == 0) {
    this->_simplifier =
         (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    if (this->_isRealLPScaled == false) {
      this->_scaler =
           (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
    }
  }
  else {
    _enableSimplifierAndScaler(this);
  }
  bVar4 = 1;
  if (this->_simplifier ==
      (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    if (this->_scaler ==
        (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      bVar4 = 0;
    }
    else {
      bVar4 = this->_isRealLPScaled ^ 1;
    }
  }
  if ((this->_solver).useTerminationValue == true) {
    local_e0 = 0x1000000000;
    local_128[0] = 0;
    local_128[1] = 0;
    local_128[2] = 0;
    local_128[3] = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    uStack_eb = 0;
    iStack_e8 = 0;
    bStack_e4 = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_128,
               this->_currentSettings->_realParamValues
               [(ulong)(this->_currentSettings->_intParamValues[0] == -1) + 8]);
    (this->_solver).objLimit.m_backend.data._M_elems[0] = local_128[0];
    (this->_solver).objLimit.m_backend.data._M_elems[1] = local_128[1];
    (this->_solver).objLimit.m_backend.data._M_elems[2] = local_128[2];
    (this->_solver).objLimit.m_backend.data._M_elems[3] = local_128[3];
    *(undefined8 *)((this->_solver).objLimit.m_backend.data._M_elems + 4) = local_118;
    *(undefined8 *)((this->_solver).objLimit.m_backend.data._M_elems + 6) = uStack_110;
    *(undefined8 *)((this->_solver).objLimit.m_backend.data._M_elems + 8) = local_108;
    *(undefined8 *)((this->_solver).objLimit.m_backend.data._M_elems + 10) = uStack_100;
    *(undefined8 *)((this->_solver).objLimit.m_backend.data._M_elems + 0xc) = local_f8;
    *(ulong *)((this->_solver).objLimit.m_backend.data._M_elems + 0xe) =
         CONCAT35(uStack_eb,uStack_f0);
    (this->_solver).objLimit.m_backend.exp = iStack_e8;
    (this->_solver).objLimit.m_backend.neg = bStack_e4;
    (this->_solver).objLimit.m_backend.fpclass = (undefined4)local_e0;
    (this->_solver).objLimit.m_backend.prec_elem = local_e0._4_4_;
  }
  else {
    ::soplex::infinity::__tls_init();
    local_130 = 0x1000000000;
    local_178[0] = 0;
    local_178[1] = 0;
    local_178[2] = 0;
    local_178[3] = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0;
    uStack_140 = 0;
    uStack_13b = 0;
    iStack_138 = 0;
    bStack_134 = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_178,*(double *)(in_FS_OFFSET + -8));
    (this->_solver).objLimit.m_backend.data._M_elems[0] = local_178[0];
    (this->_solver).objLimit.m_backend.data._M_elems[1] = local_178[1];
    (this->_solver).objLimit.m_backend.data._M_elems[2] = local_178[2];
    (this->_solver).objLimit.m_backend.data._M_elems[3] = local_178[3];
    *(undefined8 *)((this->_solver).objLimit.m_backend.data._M_elems + 4) = local_168;
    *(undefined8 *)((this->_solver).objLimit.m_backend.data._M_elems + 6) = uStack_160;
    *(undefined8 *)((this->_solver).objLimit.m_backend.data._M_elems + 8) = local_158;
    *(undefined8 *)((this->_solver).objLimit.m_backend.data._M_elems + 10) = uStack_150;
    *(undefined8 *)((this->_solver).objLimit.m_backend.data._M_elems + 0xc) = local_148;
    *(ulong *)((this->_solver).objLimit.m_backend.data._M_elems + 0xe) =
         CONCAT35(uStack_13b,uStack_140);
    (this->_solver).objLimit.m_backend.exp = iStack_138;
    (this->_solver).objLimit.m_backend.neg = bStack_134;
    (this->_solver).objLimit.m_backend.fpclass = (undefined4)local_130;
    (this->_solver).objLimit.m_backend.prec_elem = local_130._4_4_;
    (this->_solver).useTerminationValue = true;
  }
  this_01 = &this->_solver;
  if (this->_isRealLPLoaded == true) {
    if (bVar4 == 0) goto LAB_004a05d0;
    this->_realLP =
         (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    spx_alloc<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&this->_realLP,1);
    this_02 = this->_realLP;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SPxLPBase(this_02,&this_01->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    this->_realLP = this_02;
    bVar5 = false;
  }
  else {
    if (this->_hasBasis == true) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::loadLP(this_01,this->_realLP,false);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setBasis(this_01,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
    }
    else {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::loadLP(this_01,this->_realLP,true);
    }
    if (bVar4 != 0) goto LAB_004a05d0;
    (**(this->_realLP->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .
       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._vptr_ClassArray)();
    free(this->_realLP);
    this->_realLP =
         &this_01->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    bVar5 = true;
  }
  this->_isRealLPLoaded = bVar5;
LAB_004a05d0:
  if (this->_simplifier ==
      (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    simplificationStatus = OKAY;
  }
  else {
    pSVar2 = this->_currentSettings;
    bVar5 = pSVar2->_intParamValues[0xe] == 3;
    if ((pSVar2->_intParamValues[1] == 2) ||
       ((pSVar2->_intParamValues[1] == 0 &&
        ((double)((this->_solver).
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum + 1) * pSVar2->_realParamValues[0x10] <
         (double)((this->_solver).
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum + 1))))) {
      bVar5 = (bool)(pSVar2->_intParamValues[0xe] == 3 & pSVar2->_boolParamValues[8]);
    }
    dVar1 = (this->_solver).maxTime;
    (*((this->_solver).theTime)->_vptr_Timer[6])();
    simplificationStatus =
         (*this->_simplifier->_vptr_SPxSimplifier[5])
                   (SUB84(dVar1 - (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),0),
                    this->_simplifier,this_01,(ulong)bVar5,(ulong)(this->_solver).random.seedshift);
    (*this->_simplifier->_vptr_SPxSimplifier[0x10])(local_80);
    local_1c8.fpclass = cpp_dec_float_finite;
    local_1c8.prec_elem = 0x10;
    local_1c8.data._M_elems[0] = 0;
    local_1c8.data._M_elems[1] = 0;
    local_1c8.data._M_elems[2] = 0;
    local_1c8.data._M_elems[3] = 0;
    local_1c8.data._M_elems[4] = 0;
    local_1c8.data._M_elems[5] = 0;
    local_1c8.data._M_elems[6] = 0;
    local_1c8.data._M_elems[7] = 0;
    local_1c8.data._M_elems[8] = 0;
    local_1c8.data._M_elems[9] = 0;
    local_1c8.data._M_elems[10] = 0;
    local_1c8.data._M_elems[0xb] = 0;
    local_1c8.data._M_elems[0xc] = 0;
    local_1c8.data._M_elems[0xd] = 0;
    local_1c8.data._M_elems._56_5_ = 0;
    local_1c8.data._M_elems[0xf]._1_3_ = 0;
    local_1c8.exp = 0;
    local_1c8.neg = false;
    local_d8.fpclass = cpp_dec_float_finite;
    local_d8.prec_elem = 0x10;
    local_d8.data._M_elems[0] = 0;
    local_d8.data._M_elems[1] = 0;
    local_d8.data._M_elems[2] = 0;
    local_d8.data._M_elems[3] = 0;
    local_d8.data._M_elems[4] = 0;
    local_d8.data._M_elems[5] = 0;
    local_d8.data._M_elems[6] = 0;
    local_d8.data._M_elems[7] = 0;
    local_d8.data._M_elems[8] = 0;
    local_d8.data._M_elems[9] = 0;
    local_d8.data._M_elems[10] = 0;
    local_d8.data._M_elems[0xb] = 0;
    local_d8.data._M_elems[0xc] = 0;
    local_d8.data._M_elems[0xd] = 0;
    local_d8.data._M_elems._56_5_ = 0;
    local_d8.data._M_elems[0xf]._1_3_ = 0;
    local_d8.exp = 0;
    local_d8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_d8,
               this->_currentSettings->_realParamValues[0x17]);
    local_1c8.data._M_elems[0] = local_80[0];
    local_1c8.data._M_elems[1] = local_80[1];
    local_1c8.data._M_elems[2] = auStack_78[0];
    local_1c8.data._M_elems[3] = auStack_78[1];
    local_1c8.data._M_elems[4] = local_70[0];
    local_1c8.data._M_elems[5] = local_70[1];
    local_1c8.data._M_elems[6] = auStack_68[0];
    local_1c8.data._M_elems[7] = auStack_68[1];
    local_1c8.data._M_elems[8] = local_60[0];
    local_1c8.data._M_elems[9] = local_60[1];
    local_1c8.data._M_elems[10] = auStack_58[0];
    local_1c8.data._M_elems[0xb] = auStack_58[1];
    local_1c8.data._M_elems[0xc] = local_50[0];
    local_1c8.data._M_elems[0xd] = local_50[1];
    local_1c8.data._M_elems._56_5_ = SUB85(local_50._8_8_,0);
    local_1c8.data._M_elems[0xf]._1_3_ = SUB83(local_50._8_8_,5);
    local_1c8.exp = local_40;
    local_1c8.neg = (bool)local_3c;
    local_1c8.fpclass = local_38;
    local_1c8.prec_elem = iStack_34;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
              (&local_1c8,&local_d8);
    *(undefined8 *)
     ((this->_solver).
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .offset.m_backend.data._M_elems + 0xc) = local_1c8.data._M_elems._48_8_;
    *(ulong *)((this->_solver).
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .offset.m_backend.data._M_elems + 0xe) =
         CONCAT35(local_1c8.data._M_elems[0xf]._1_3_,local_1c8.data._M_elems._56_5_);
    *(undefined8 *)
     ((this->_solver).
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .offset.m_backend.data._M_elems + 8) = local_1c8.data._M_elems._32_8_;
    *(undefined8 *)
     ((this->_solver).
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .offset.m_backend.data._M_elems + 10) = local_1c8.data._M_elems._40_8_;
    *(undefined8 *)
     ((this->_solver).
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .offset.m_backend.data._M_elems + 4) = local_1c8.data._M_elems._16_8_;
    *(undefined8 *)
     ((this->_solver).
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .offset.m_backend.data._M_elems + 6) = local_1c8.data._M_elems._24_8_;
    (this_00->m_backend).data._M_elems[0] = local_1c8.data._M_elems[0];
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.data._M_elems[1] = local_1c8.data._M_elems[1];
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.data._M_elems[2] = local_1c8.data._M_elems[2];
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.data._M_elems[3] = local_1c8.data._M_elems[3];
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.exp = local_1c8.exp;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.neg = local_1c8.neg;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.fpclass = local_1c8.fpclass;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .offset.m_backend.prec_elem = local_1c8.prec_elem;
    (this->_solver).
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ._isScaled = false;
    this->_applyPolishing = true;
    (this->_solver).polishObj = POLISH_OFF;
  }
  (*this->_statistics->preprocessingTime->_vptr_Timer[4])();
  if (simplificationStatus == OKAY) {
    pSVar3 = this->_scaler;
    if ((pSVar3 != (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) &&
       ((this->_solver).
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ._isScaled == false)) {
      (*pSVar3->_vptr_SPxScaler[0xd])(pSVar3,this_01,0);
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::invalidate(&(this->_solver).
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  );
      (*(this->_solver).
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x77])(this_01);
      (*(this->_solver).
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this_01);
    }
    _solveRealLPAndRecordStatistics(this,interrupt);
  }
  _evaluateSolutionReal(this,simplificationStatus);
  return;
}

Assistant:

void SoPlexBase<R>::_preprocessAndSolveReal(bool applySimplifier, volatile bool* interrupt)
{
   _solver.changeObjOffset(realParam(SoPlexBase<R>::OBJ_OFFSET));
   _statistics->preprocessingTime->start();

   _applyPolishing = false;

   if(applySimplifier)
      _enableSimplifierAndScaler();
   else
      _disableSimplifierAndScaler();

   // create a copy of the LP when simplifying or when using internal scaling, i.e. w/o persistent scaling
   bool copyLP = (_simplifier != nullptr || (_scaler && !_isRealLPScaled));

   // set the objective limit if it was not explicitly disabled for this particular solving call
   if(_solver.isTerminationValueEnabled())
   {
      _solver.setTerminationValue(intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE
                                  ? realParam(SoPlexBase<R>::OBJLIMIT_UPPER) : realParam(SoPlexBase<R>::OBJLIMIT_LOWER));
   }
   // reset the objective limit and reenabled it for the next solve
   else
   {
      _solver.setTerminationValue();
      _solver.toggleTerminationValue(true);
   }

   if(_isRealLPLoaded)
   {
      assert(_realLP == &_solver);

      // preprocessing is always applied to the LP in the solver; hence we have to create a copy of the original LP
      // if simplifier is turned on
      if(copyLP)
      {
         _realLP = nullptr;
         spx_alloc(_realLP);
         _realLP = new(_realLP) SPxLPBase<R>(_solver);
         _isRealLPLoaded = false;
      }
   }
   else
   {
      assert(_realLP != &_solver);

      // load real LP and basis if available
      if(_hasBasis)
      {
         assert(_basisStatusRows.size() == numRows());
         assert(_basisStatusCols.size() == this->numCols());

         _solver.loadLP(*_realLP, false);
         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      }
      // load real LP and set up slack basis
      else
         _solver.loadLP(*_realLP, true);

      // if there is no simplifier, then the original and the transformed problem are identical and it is more
      // memory-efficient to keep only the problem in the solver
      if(!copyLP)
      {
         _realLP->~SPxLPBase<R>();
         spx_free(_realLP);
         _realLP = &_solver;
         _isRealLPLoaded = true;
      }
   }

   // assert that we have two problems if and only if we apply the simplifier
   assert(_realLP == &_solver || copyLP);
   assert(_realLP != &_solver || !copyLP);

   // apply problem simplification
   typename SPxSimplifier<R>::Result simplificationStatus = SPxSimplifier<R>::OKAY;

   if(_simplifier)
   {
      assert(!_isRealLPLoaded);
      // do not remove bounds of boxed variables or sides of ranged rows if bound flipping is used; also respect row-boundflip parameter
      bool keepbounds = intParam(SoPlexBase<R>::RATIOTESTER) == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING;

      if(intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
         keepbounds &= boolParam(SoPlexBase<R>::ROWBOUNDFLIPS);

      Real remainingTime = _solver.getMaxTime() - _solver.time();
      simplificationStatus = _simplifier->simplify(_solver, remainingTime, keepbounds,
                             _solver.random.getSeed());
      _solver.changeObjOffset(_simplifier->getObjoffset() + realParam(SoPlexBase<R>::OBJ_OFFSET));
      _solver.setScalingInfo(false);
      _applyPolishing = true;

      _solver.setSolutionPolishing(SPxSolverBase<R>::POLISH_OFF);
   }

   _statistics->preprocessingTime->stop();

   // run the simplex method if problem has not been solved by the simplifier
   if(simplificationStatus == SPxSimplifier<R>::OKAY)
   {
      if(_scaler && !_solver.isScaled())
      {
         _scaler->scale(_solver, false);
         _solver.invalidateBasis();
      }

      _solveRealLPAndRecordStatistics(interrupt);
   }

   _evaluateSolutionReal(simplificationStatus);
}